

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# po_man.cpp
# Opt level: O2

bool __thiscall FPolyObj::MovePolyobj(FPolyObj *this,DVector2 *pos,bool force)

{
  DVector2 DVar1;
  DVector2 DVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  FBoundingBox bounds;
  bool bVar6;
  undefined7 in_register_00000011;
  FPolyObj *this_00;
  byte bVar7;
  uint i;
  ulong uVar8;
  FBoundingBox oldbounds;
  FBoundingBox local_78;
  DVector2 local_58;
  undefined1 local_48 [32];
  
  local_78.m_Box[0] = (this->Bounds).m_Box[0];
  local_78.m_Box[1] = (this->Bounds).m_Box[1];
  local_78.m_Box[2] = (this->Bounds).m_Box[2];
  local_78.m_Box[3] = (this->Bounds).m_Box[3];
  UnLinkPolyobj(this);
  DoMovePolyobj(this,pos);
  if ((int)CONCAT71(in_register_00000011,force) == 0) {
    bVar7 = 0;
    for (uVar8 = 0; uVar8 < (this->Sidedefs).Count; uVar8 = uVar8 + 1) {
      bVar6 = CheckMobjBlocking(this,(this->Sidedefs).Array[uVar8]);
      bVar7 = bVar7 | bVar6;
    }
    if (bVar7 != 0) {
      local_58.X._0_4_ = *(undefined4 *)&pos->X;
      local_58.Y._0_4_ = *(undefined4 *)&pos->Y;
      local_58.X._4_4_ = *(uint *)((long)&pos->X + 4) ^ 0x80000000;
      local_58.Y._4_4_ = *(uint *)((long)&pos->Y + 4) ^ 0x80000000;
      DoMovePolyobj(this,&local_58);
      LinkPolyobj(this);
      return false;
    }
  }
  dVar3 = (this->StartSpot).pos.Y + pos->Y;
  dVar5 = (this->CenterSpot).pos.X;
  dVar4 = (this->CenterSpot).pos.Y;
  DVar1.Y._0_4_ = SUB84(dVar3,0);
  DVar1.X = (this->StartSpot).pos.X + pos->X;
  DVar1.Y._4_4_ = (int)((ulong)dVar3 >> 0x20);
  (this->StartSpot).pos = DVar1;
  dVar4 = pos->Y + dVar4;
  DVar2.Y._0_4_ = SUB84(dVar4,0);
  DVar2.X = pos->X + dVar5;
  DVar2.Y._4_4_ = (int)((ulong)dVar4 >> 0x20);
  (this->CenterSpot).pos = DVar2;
  LinkPolyobj(this);
  ClearSubsectorLinks(this);
  this_00 = (FPolyObj *)local_48;
  FBoundingBox::operator|(&this->Bounds,&local_78);
  bounds.m_Box[1] = (double)local_48._8_8_;
  bounds.m_Box[0] = (double)local_48._0_8_;
  bounds.m_Box[2] = (double)local_48._16_8_;
  bounds.m_Box[3] = (double)local_48._24_8_;
  RecalcActorFloorCeil(this_00,bounds);
  return true;
}

Assistant:

bool FPolyObj::MovePolyobj (const DVector2 &pos, bool force)
{
	FBoundingBox oldbounds = Bounds;
	UnLinkPolyobj ();
	DoMovePolyobj (pos);

	if (!force)
	{
		bool blocked = false;

		for(unsigned i=0;i < Sidedefs.Size(); i++)
		{
			if (CheckMobjBlocking(Sidedefs[i]))
			{
				blocked = true;
			}
		}
		if (blocked)
		{
			DoMovePolyobj (-pos);
			LinkPolyobj();
			return false;
		}
	}
	StartSpot.pos += pos;
	CenterSpot.pos += pos;
	LinkPolyobj ();
	ClearSubsectorLinks();
	RecalcActorFloorCeil(Bounds | oldbounds);
	return true;
}